

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O3

vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> * __thiscall
pbrt::PMJ02BNSampler::Clone
          (vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> *__return_storage_ptr__
          ,PMJ02BNSampler *this,int n,Allocator alloc)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  vector<pbrt::Point2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Point2<float>_>_> *pvVar3;
  Tuple2<pbrt::Point2,_int> TVar4;
  int iVar5;
  undefined4 extraout_var;
  pointer pSVar7;
  long lVar8;
  allocator_type local_29;
  long lVar6;
  
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::vector
            (__return_storage_ptr__,(long)n,&local_29);
  if (n != 0) {
    iVar5 = (*(alloc.memoryResource)->_vptr_memory_resource[2])
                      (alloc.memoryResource,(long)n * 0x28,8);
    lVar6 = CONCAT44(extraout_var,iVar5);
    if (0 < n) {
      pSVar7 = (__return_storage_ptr__->
               super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>).
               _M_impl.super__Vector_impl_data._M_start;
      lVar8 = 0;
      do {
        *(undefined8 *)(lVar6 + 0x20 + lVar8) = *(undefined8 *)&this->sampleIndex;
        uVar2 = *(undefined8 *)&this->pixelTileSize;
        pvVar3 = this->pixelSamples;
        TVar4 = (this->pixel).super_Tuple2<pbrt::Point2,_int>;
        puVar1 = (undefined8 *)(lVar6 + lVar8);
        *puVar1 = *(undefined8 *)this;
        puVar1[1] = uVar2;
        puVar1[2] = pvVar3;
        *(Tuple2<pbrt::Point2,_int> *)(puVar1 + 3) = TVar4;
        (pSVar7->
        super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
        ).bits = lVar6 + lVar8 | 0x7000000000000;
        lVar8 = lVar8 + 0x28;
        pSVar7 = pSVar7 + 1;
      } while ((ulong)(uint)n * 0x28 != lVar8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SamplerHandle> PMJ02BNSampler::Clone(int n, Allocator alloc) {
    std::vector<SamplerHandle> samplers(n);
    PMJ02BNSampler *samplerMem =
        (PMJ02BNSampler *)alloc.allocate_object<PMJ02BNSampler>(n);
    for (int i = 0; i < n; ++i) {
        alloc.construct(&samplerMem[i], *this);
        samplers[i] = &samplerMem[i];
    }
    return samplers;
}